

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int i;
  long lVar6;
  ImVector<stbrp_rect> pack_rects;
  
  pack_rects.Size = 0;
  pack_rects.Capacity = 0;
  pack_rects.Data = (stbrp_rect *)0x0;
  ImVector<stbrp_rect>::resize(&pack_rects,(atlas->CustomRects).Size);
  memset(pack_rects.Data,0,(long)pack_rects.Size << 4);
  iVar5 = (atlas->CustomRects).Size;
  lVar3 = 4;
  for (lVar6 = 0; lVar6 < iVar5; lVar6 = lVar6 + 1) {
    *(undefined4 *)((long)&(pack_rects.Data)->id + lVar3) =
         *(undefined4 *)((long)(atlas->CustomRects).Data + lVar3 * 2 + -4);
    lVar3 = lVar3 + 0x10;
  }
  stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,pack_rects.Data,pack_rects.Size);
  uVar4 = 0;
  uVar2 = pack_rects._0_8_ & 0xffffffff;
  if (pack_rects.Size < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
    if (*(int *)((long)&(pack_rects.Data)->was_packed + uVar4) != 0) {
      uVar1 = *(uint *)((long)&(pack_rects.Data)->x + uVar4);
      *(uint *)(&((atlas->CustomRects).Data)->X + uVar4) = uVar1;
      iVar5 = (uint)*(ushort *)((long)&(pack_rects.Data)->h + uVar4) + (uVar1 >> 0x10);
      if (iVar5 < atlas->TexHeight) {
        iVar5 = atlas->TexHeight;
      }
      atlas->TexHeight = iVar5;
    }
  }
  ImVector<stbrp_rect>::~ImVector(&pack_rects);
  return;
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;

    ImVector<ImFontAtlas::CustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = pack_rects[i].x;
            user_rects[i].Y = pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}